

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC16.cpp
# Opt level: O2

void CRC16::init_crc_table(void)

{
  uint16_t i;
  long lVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  if (s_crc_lookup._M_elems[0] == 0) {
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      uVar2 = (int)lVar1 << 8;
      iVar3 = 8;
      while( true ) {
        bVar4 = iVar3 == 0;
        iVar3 = iVar3 + -1;
        if (bVar4) break;
        uVar2 = (uint)(int)(short)(unsigned_short)uVar2 >> 0xf & 0x1021 ^ uVar2 * 2;
      }
      s_crc_lookup._M_elems[lVar1] = (unsigned_short)uVar2;
    }
  }
  return;
}

Assistant:

void CRC16::init_crc_table()
{
    if (!s_crc_lookup[0])
    {
        for (uint16_t i = 0; i < 256; ++i)
        {
            uint16_t crc = i << 8;

            for (int j = 0; j < 8; ++j)
                crc = (crc << 1) ^ ((crc & 0x8000) ? POLYNOMIAL : 0);

            s_crc_lookup[i] = crc;
        }
    }
}